

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

void __thiscall
cfgfile::details::parser_conffile_impl_t<cfgfile::qstring_trait_t>::parse
          (parser_conffile_impl_t<cfgfile::qstring_trait_t> *this,string_t *file_name)

{
  value_type ptVar1;
  bool bVar2;
  lexeme_type_t lVar3;
  reference pptVar4;
  string_t *psVar5;
  allocator<char> *__a;
  long in_RDI;
  lexical_analyzer_t<cfgfile::qstring_trait_t> *in_stack_00000328;
  lexeme_t<cfgfile::qstring_trait_t> lexeme;
  lexeme_t<cfgfile::qstring_trait_t> *in_stack_fffffffffffffc98;
  lexeme_t<cfgfile::qstring_trait_t> *in_stack_fffffffffffffca0;
  string_t *in_stack_fffffffffffffca8;
  parser_info_t<cfgfile::qstring_trait_t> *in_stack_fffffffffffffcb0;
  exception_t<cfgfile::qstring_trait_t> *this_00;
  string *str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce0;
  exception_t<cfgfile::qstring_trait_t> local_231 [2];
  parser_base_t<cfgfile::qstring_trait_t> *in_stack_fffffffffffffe40;
  string local_171 [6];
  child_tags_list_t *in_stack_ffffffffffffff50;
  tag_t<cfgfile::qstring_trait_t> *in_stack_ffffffffffffff58;
  parser_conffile_impl_t<cfgfile::qstring_trait_t> *in_stack_ffffffffffffff60;
  undefined1 local_90 [40];
  undefined1 local_68 [56];
  lexeme_t<cfgfile::qstring_trait_t> local_30;
  
  bVar2 = start_first_tag_parsing((parser_conffile_impl_t<cfgfile::qstring_trait_t> *)file_name);
  if (bVar2) {
    lexical_analyzer_t<cfgfile::qstring_trait_t>::next_lexeme(in_stack_00000328);
    while (bVar2 = lexeme_t<cfgfile::qstring_trait_t>::is_null(&local_30),
          ((bVar2 ^ 0xffU) & 1) != 0) {
      bVar2 = std::
              stack<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::deque<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
              ::empty((stack<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::deque<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
                       *)0x134047);
      if (bVar2) {
        __a = (allocator<char> *)__cxa_allocate_exception(0x28);
        str = local_171;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffce0,(char *)str,__a);
        qstring_trait_t::from_ascii(str);
        lexeme_t<cfgfile::qstring_trait_t>::value(&local_30);
        operator+((qstring_wrapper_t *)str,(qstring_wrapper_t *)__a);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffce0,(char *)str,__a);
        qstring_trait_t::from_ascii(str);
        operator+((qstring_wrapper_t *)str,(qstring_wrapper_t *)__a);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffce0,(char *)str,__a);
        qstring_trait_t::from_ascii(str);
        operator+((qstring_wrapper_t *)str,(qstring_wrapper_t *)__a);
        operator+((qstring_wrapper_t *)str,(qstring_wrapper_t *)__a);
        this_00 = local_231;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffce0,(char *)str,__a);
        qstring_trait_t::from_ascii(str);
        operator+((qstring_wrapper_t *)str,(qstring_wrapper_t *)__a);
        psVar5 = (string_t *)
                 lexical_analyzer_t<cfgfile::qstring_trait_t>::line_number
                           ((lexical_analyzer_t<cfgfile::qstring_trait_t> *)(in_RDI + 0x60));
        qstring_trait_t::to_string((pos_t)str);
        operator+((qstring_wrapper_t *)str,(qstring_wrapper_t *)__a);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffce0,(char *)str,__a);
        qstring_trait_t::from_ascii(str);
        operator+((qstring_wrapper_t *)str,(qstring_wrapper_t *)__a);
        exception_t<cfgfile::qstring_trait_t>::exception_t(this_00,psVar5);
        __cxa_throw(__a,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                    exception_t<cfgfile::qstring_trait_t>::~exception_t);
      }
      lVar3 = lexeme_t<cfgfile::qstring_trait_t>::type(&local_30);
      if (lVar3 == start) {
        std::
        stack<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::deque<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
        ::top((stack<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::deque<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
               *)0x1340cc);
        pptVar4 = std::
                  stack<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::deque<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
                  ::top((stack<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::deque<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
                         *)0x1340e4);
        (*(*pptVar4)->_vptr_tag_t[2])();
        start_tag_parsing(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                          in_stack_ffffffffffffff50);
      }
      else if (lVar3 == finish) {
        pptVar4 = std::
                  stack<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::deque<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
                  ::top((stack<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::deque<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
                         *)0x134218);
        ptVar1 = *pptVar4;
        lexical_analyzer_t<cfgfile::qstring_trait_t>::line_number
                  ((lexical_analyzer_t<cfgfile::qstring_trait_t> *)(in_RDI + 0x60));
        in_stack_fffffffffffffce0 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             lexical_analyzer_t<cfgfile::qstring_trait_t>::column_number
                       ((lexical_analyzer_t<cfgfile::qstring_trait_t> *)(in_RDI + 0x60));
        parser_info_t<cfgfile::qstring_trait_t>::parser_info_t
                  (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
                   (pos_t)in_stack_fffffffffffffca0,(pos_t)in_stack_fffffffffffffc98);
        (*ptVar1->_vptr_tag_t[6])(ptVar1,local_90);
        parser_info_t<cfgfile::qstring_trait_t>::~parser_info_t
                  ((parser_info_t<cfgfile::qstring_trait_t> *)0x1342a0);
        std::
        stack<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::deque<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
        ::pop((stack<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::deque<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
               *)0x1342b1);
      }
      else if (lVar3 == string) {
        pptVar4 = std::
                  stack<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::deque<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
                  ::top((stack<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::deque<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
                         *)0x13412f);
        ptVar1 = *pptVar4;
        lexical_analyzer_t<cfgfile::qstring_trait_t>::line_number
                  ((lexical_analyzer_t<cfgfile::qstring_trait_t> *)(in_RDI + 0x60));
        lexical_analyzer_t<cfgfile::qstring_trait_t>::column_number
                  ((lexical_analyzer_t<cfgfile::qstring_trait_t> *)(in_RDI + 0x60));
        parser_info_t<cfgfile::qstring_trait_t>::parser_info_t
                  (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
                   (pos_t)in_stack_fffffffffffffca0,(pos_t)in_stack_fffffffffffffc98);
        psVar5 = lexeme_t<cfgfile::qstring_trait_t>::value(&local_30);
        (*ptVar1->_vptr_tag_t[7])(ptVar1,local_68,psVar5);
        parser_info_t<cfgfile::qstring_trait_t>::~parser_info_t
                  ((parser_info_t<cfgfile::qstring_trait_t> *)0x1341dc);
      }
      lexical_analyzer_t<cfgfile::qstring_trait_t>::next_lexeme(in_stack_00000328);
      lexeme_t<cfgfile::qstring_trait_t>::operator=
                (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
      lexeme_t<cfgfile::qstring_trait_t>::~lexeme_t((lexeme_t<cfgfile::qstring_trait_t> *)0x1348e7);
    }
    parser_base_t<cfgfile::qstring_trait_t>::check_parser_state_after_parsing
              (in_stack_fffffffffffffe40);
    lexeme_t<cfgfile::qstring_trait_t>::~lexeme_t((lexeme_t<cfgfile::qstring_trait_t> *)0x134908);
  }
  return;
}

Assistant:

void parse( const typename Trait::string_t & file_name ) override
	{
		if( !start_first_tag_parsing() )
			return;

		lexeme_t< Trait > lexeme = m_lex.next_lexeme();

		while( !lexeme.is_null() )
		{
			if( !this->m_stack.empty() )
			{
				switch( lexeme.type() )
				{
					case lexeme_type_t::start :
						start_tag_parsing( *this->m_stack.top(),
							this->m_stack.top()->children() );
						break;

					case lexeme_type_t::string :
						this->m_stack.top()->on_string( parser_info_t< Trait >(
								file_name,
								m_lex.line_number(),
								m_lex.column_number() ),
							lexeme.value() );
						break;

					case lexeme_type_t::finish :
					{
						this->m_stack.top()->on_finish( parser_info_t< Trait >(
							file_name,
							m_lex.line_number(),
							m_lex.column_number() ) );
						this->m_stack.pop();
					}
						break;

					default:
						break;
				}
			}
			else
				throw exception_t< Trait >(
					Trait::from_ascii( "Unexpected content. "
						"We've finished parsing, but we've got this: \"" ) +
					lexeme.value() + Trait::from_ascii( "\". " ) +
					Trait::from_ascii( "In file \"" ) + file_name +
					Trait::from_ascii( "\" on line " ) +
					Trait::to_string( m_lex.line_number() ) +
					Trait::from_ascii( "." ) );


			lexeme = m_lex.next_lexeme();
		}

		this->check_parser_state_after_parsing();
	}